

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

int xmlTextReaderMoveToNextAttribute(xmlTextReaderPtr reader)

{
  xmlNodePtr pxVar1;
  xmlNodePtr pxVar2;
  _xmlNode *p_Var3;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    return -1;
  }
  pxVar1 = reader->node;
  if (pxVar1 == (xmlNodePtr)0x0) {
    return -1;
  }
  if (pxVar1->type != XML_ELEMENT_NODE) {
    return 0;
  }
  pxVar2 = reader->curnode;
  if (pxVar2 == (xmlNodePtr)0x0) {
    p_Var3 = (_xmlNode *)pxVar1->nsDef;
LAB_0017678b:
    if (p_Var3 != (_xmlNode *)0x0) goto LAB_0017679f;
    p_Var3 = (_xmlNode *)pxVar1->properties;
  }
  else {
    if (pxVar2->type != XML_ATTRIBUTE_NODE) {
      if (pxVar2->type != XML_NAMESPACE_DECL) {
        return 0;
      }
      p_Var3 = (_xmlNode *)pxVar2->_private;
      goto LAB_0017678b;
    }
    p_Var3 = pxVar2->next;
  }
  if (p_Var3 == (_xmlNode *)0x0) {
    return 0;
  }
LAB_0017679f:
  reader->curnode = p_Var3;
  return 1;
}

Assistant:

int
xmlTextReaderMoveToNextAttribute(xmlTextReaderPtr reader) {
    if (reader == NULL)
	return(-1);
    if (reader->node == NULL)
	return(-1);
    if (reader->node->type != XML_ELEMENT_NODE)
	return(0);
    if (reader->curnode == NULL)
	return(xmlTextReaderMoveToFirstAttribute(reader));

    if (reader->curnode->type == XML_NAMESPACE_DECL) {
	xmlNsPtr ns = (xmlNsPtr) reader->curnode;
	if (ns->next != NULL) {
	    reader->curnode = (xmlNodePtr) ns->next;
	    return(1);
	}
	if (reader->node->properties != NULL) {
	    reader->curnode = (xmlNodePtr) reader->node->properties;
	    return(1);
	}
	return(0);
    } else if ((reader->curnode->type == XML_ATTRIBUTE_NODE) &&
	       (reader->curnode->next != NULL)) {
	reader->curnode = reader->curnode->next;
	return(1);
    }
    return(0);
}